

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt32emu-smf2wav.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  mt32emu_bit8u *pmVar1;
  char cVar2;
  bool bVar3;
  gchar *pgVar4;
  int iVar5;
  uint uVar6;
  mt32emu_return_code mVar7;
  mt32emu_bit32u mVar8;
  mt32emu_boolean mVar9;
  char *pcVar10;
  char *pcVar11;
  undefined8 uVar12;
  gchar **ppgVar13;
  size_t sVar14;
  GDir *romDir;
  char *pcVar15;
  size_t rom_ids_size;
  char **ppcVar16;
  FILE *__s;
  clock_t cVar17;
  void *pvVar18;
  smf_t *smf;
  smf_event_t *event;
  byte *pbVar19;
  clock_t cVar20;
  uint uVar21;
  ulong uVar22;
  mt32emu_bit32u mVar23;
  ulong uVar24;
  uchar *sysex;
  long lVar25;
  gchar *pgVar26;
  gchar *pgVar27;
  ulong uVar28;
  mt32emu_bit32u mVar29;
  long *plVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  Service service;
  gchar *deprecatedSysexFile;
  gchar **rawStreams;
  gint outputSampleFormat;
  gint srcQualityIx;
  gint rendererTypeIx;
  gint analogOutputModeIx;
  gint dacInputModeIx;
  Options options;
  gint renderMaxFrames;
  gint renderMinFrames;
  gint bufferFrameCount;
  gint partialCount;
  mt32emu_rom_info rom_info;
  Service local_6d0;
  mt32emu_bit8u *local_6c8;
  char **local_6c0;
  char local_6b1;
  ulong local_6b0;
  ulong local_6a8;
  gchar *local_6a0;
  long *local_698;
  char *local_690;
  char **local_688;
  OUTPUT_SAMPLE_FORMAT local_67c;
  uint local_678;
  uint local_674;
  uint local_670;
  uint local_66c;
  Options local_668;
  uint local_5cc;
  uint local_5c8;
  uint local_5c4;
  mt32emu_bit32u local_5c0;
  int local_5bc;
  FILE *local_5b8;
  char *local_5b0;
  char *local_5a8;
  clock_t local_5a0;
  gchar **local_598;
  uchar *local_590;
  char *local_588;
  undefined8 local_580;
  undefined1 local_578 [80];
  char *local_528;
  ulong uStack_520;
  char *local_518;
  undefined1 local_510;
  undefined8 local_50c;
  gboolean *local_500;
  char *local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined1 local_4e0;
  undefined8 local_4dc;
  gchar **local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 local_4b0;
  undefined8 local_4ac;
  gchar **local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 local_480;
  undefined8 local_47c;
  uint *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 local_450;
  undefined8 local_44c;
  gint *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_41c;
  uint *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 local_3f0;
  undefined8 local_3ec;
  mt32emu_bit32u *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 local_3c0;
  undefined8 local_3bc;
  uint *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_38c;
  uint *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_35c;
  OUTPUT_SAMPLE_FORMAT *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_32c;
  uint *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2fc;
  long **local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2cc;
  uint *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_29c;
  uint *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_26c;
  gint *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_23c;
  gint *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_20c;
  gint *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1dc;
  gboolean *local_1d0;
  char *local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1ac;
  gboolean *local_1a0;
  char *local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_17c;
  gboolean *local_170;
  char *local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_14c;
  gboolean *local_140;
  char *local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_11c;
  gboolean *local_110;
  char *local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_ec;
  gboolean *local_e0;
  char *local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_bc;
  gchar **local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_8c;
  Options *local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined8 local_5c;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  local_6d0.c = (mt32emu_context)0x0;
  setlocale(6,"");
  pcVar10 = mt32emu_get_library_version_string();
  printf("Munt MT32Emu MIDI to Wave Conversion Utility. Version %s\n","1.9.0");
  puts("  Copyright (C) 2009, 2011 Jerome Fisher <re_munt@kingguppy.com>");
  puts("  Copyright (C) 2012-2022 Jerome Fisher, Sergey V. Mikayev");
  pcVar11 = smf_get_version();
  printf("Using Munt MT32Emu Library Version %s, libsmf Version %s (with modifications)\n",pcVar10,
         pcVar11);
  local_410 = &local_678;
  local_678 = 2;
  ppgVar13 = &local_668.outputFilename;
  local_578._72_8_ = &local_668.force;
  local_4a0 = &local_668.machineID;
  local_668.dacInputMode = DACInputMode_NICE;
  local_668.analogOutputMode = AnalogOutputMode_DIGITAL_ONLY;
  local_668.rendererType = RendererType_BIT16S;
  local_668.machineID = (char *)0x0;
  local_668.force = 0;
  local_668.quiet = 0;
  local_668.romDir = (char *)0x0;
  local_668.inputFilenames = (gchar **)0x0;
  local_668.outputFilename = (char *)0x0;
  local_668.srcQuality = SamplerateConversionQuality_GOOD;
  local_578._0_8_ = "output";
  local_578[8] = 0x6f;
  local_578._12_4_ = 0;
  local_578._16_4_ = 4;
  local_578[0x18] = SUB81(ppgVar13,0);
  local_578[0x19] = (undefined1)((ulong)ppgVar13 >> 8);
  local_578[0x1a] = (undefined1)((ulong)ppgVar13 >> 0x10);
  local_578[0x1b] = (undefined1)((ulong)ppgVar13 >> 0x18);
  local_578[0x1c] = (undefined1)((ulong)ppgVar13 >> 0x20);
  local_578[0x1d] = (undefined1)((ulong)ppgVar13 >> 0x28);
  local_578[0x1e] = (undefined1)((ulong)ppgVar13 >> 0x30);
  local_578[0x1f] = (undefined1)((ulong)ppgVar13 >> 0x38);
  local_578[0x20] = 0x13;
  local_578[0x21] = 0x22;
  local_578[0x22] = 0x12;
  local_578[0x23] = 0;
  local_578._36_4_ = 0;
  local_578._40_4_ = 0x122255;
  local_578._44_4_ = 0;
  local_578._48_8_ = "force";
  local_500 = &local_668.quiet;
  local_578[0x38] = 0x66;
  local_578._60_4_ = 0;
  local_578._64_4_ = 0;
  local_528 = "Overwrite the output file if it already exists";
  uStack_520 = 0;
  local_518 = "quiet";
  local_4d0 = &local_668.romDir;
  local_510 = 0x71;
  local_50c = 0;
  local_4f8 = "Be quiet";
  local_4f0 = 0;
  local_4e8 = "rom-dir";
  local_4e0 = 0x6d;
  local_4dc = 0x100000000;
  local_4c8 = "Directory in which ROMs are stored";
  local_4c0 = "<directory>";
  local_4b8 = "machine-id";
  local_470 = &local_5c4;
  local_5c4 = 0x20000;
  local_4b0 = 0x69;
  local_4ac = 0x100000000;
  local_498 = 
  "ID of machine configuration to search ROMs for (default: any)\n                 any:        try cm32l first, then mt32\n                 mt32:       any complete set of MT-32 ROMs, the highest control ROM version found wins\n                 cm32l:      any complete set of CM-32L / LAPC-I compatible ROMs, the highest control ROM version found wins\n                 mt32_1_04:  MT-32 with control ROM version 1.04\n                 mt32_1_05:  MT-32 with control ROM version 1.05\n                 mt32_1_06:  MT-32 with control ROM version 1.06\n                 mt32_1_07:  MT-32 with control ROM version 1.07\n                 mt32_bluer: MT-32 Blue Ridge mod version X.XX\n                 mt32_2_03:  MT-32 with control ROM version 2.03\n                 mt32_2_04:  MT-32 with control ROM version 2.04\n                 mt32_2_06:  MT-32 with control ROM version 2.06\n                 mt32_2_07:  MT-32 with control ROM version 2.07\n                 cm32l_1_00: CM-32L / LAPC-I with control ROM version 1.00\n                 cm32l_1_02: CM-32L / LAPC-I with control ROM version 1.02\n                 cm32ln_1_00: CM-32LN / CM-500 / LAPC-N with control ROM version 1.00"
  ;
  local_490 = "<machine_id>";
  local_488 = "buffer-size";
  local_480 = 0x62;
  local_47c = 0x200000000;
  local_468 = "Buffer size in frames (minimum: 1)";
  local_460 = "<frame_count>";
  local_458 = "sample-rate";
  local_440 = &local_668.sampleRate;
  local_668.sampleRate = 0;
  local_668.rawChannelCount = 0;
  local_668.outputSampleFormat = OUTPUT_SAMPLE_FORMAT_SINT16;
  local_450 = 0x70;
  local_44c = 0x200000000;
  local_438 = 
  "Sample rate in Hz (minimum: 1, default: auto)\n                Ignored if -w is used (in which case auto is always used)\n"
  ;
  local_430 = "<sample_rate>";
  local_428 = "src-quality";
  local_420 = 0x71;
  local_41c = 0x200000000;
  local_408 = 
  "Sample rate conversion quality (default: 2)\n                 0: FASTEST\n                 1: FAST\n                 2: GOOD\n                 3: BEST"
  ;
  local_400 = "<src_quality>";
  local_3f8 = "max-partials";
  local_3e0 = &local_5c0;
  local_5c0 = 0x20;
  local_3f0 = 0x78;
  local_3ec = 0x200000000;
  local_3d8 = 
  "The maximum number of partials playing simultaneously.\n                (minimum: 8, default: 32)\n"
  ;
  local_3d0 = "<max-partials>";
  local_3c8 = "analog-output-mode";
  local_3b0 = &local_670;
  local_670 = 0;
  local_3c0 = 0x61;
  local_3bc = 0x200000000;
  local_3a8 = 
  "Analogue low-pass filter emulation mode (default: 0)\n                Ignored if -w is used (in which case 0/DISABLED is always used)\n                 0: DISABLED\n                 1: COARSE\n                 2: ACCURATE\n                 3: OVERSAMPLED"
  ;
  local_3a0 = "<analog_output_mode>";
  local_398 = "renderer-type";
  local_380 = &local_674;
  local_674 = 0;
  local_390 = 0x72;
  local_38c = 0x200000000;
  local_378 = 
  "Type of samples to use in renderer and wave generator (default: 0)\n                 0: Integer 16-bit\n                 1: Float 32-bit\n"
  ;
  local_370 = "<renderer_type>";
  local_368 = "output-sample-format";
  local_350 = &local_67c;
  local_67c = OUTPUT_SAMPLE_FORMAT_SINT16;
  local_360 = 0;
  local_35c = 0x200000000;
  local_348 = 
  "Format of output samples (default: 0)\n                 0: Signed Integer 16-bit\n                 1: IEEE 754 Float 32-bit\n"
  ;
  local_340 = "<output_sample_format>";
  local_338 = "dac-input-mode";
  local_320 = &local_66c;
  local_66c = 0;
  local_330 = 100;
  local_32c = 0x200000000;
  local_318 = 
  "LA-32 to DAC input mode (default: 0)\n                Ignored if -w is used (in which case 1/PURE is always used)\n                 0: NICE\n                 1: PURE\n                 2: GENERATION1\n                 3: GENERATION2"
  ;
  local_310 = "<dac_input_mode>";
  local_308 = "raw-stream";
  local_300 = 0x77;
  local_2fc = 0x500000000;
  local_2f0 = &local_698;
  local_698 = (long *)0x0;
  local_2e8 = 
  "Write a raw file with signed 16-bit big-endian samples instead of a WAVE file, and include the specified channel.\n                This option can be specified multiple times (up to eight), in which case streams will be written to the file multiplexed sample-by-sample in the order given.\n                Available stream IDs:\n                -1: Dummy stream filled with 0\n                 0: [LA32] Left non-reverb\n                 1: [LA32] Right non-reverb\n                 2: [LA32] Left reverb dry\n                 3: [LA32] Right reverb dry\n                 4: [Reverb] Left reverb wet\n                 5: [Reverb] Right reverb wet"
  ;
  local_2e0 = "<stream_id>";
  local_2d8 = "render-min";
  local_2c0 = &local_5c8;
  local_5c8 = 0;
  local_2d0 = 0;
  local_2cc = 0x200000000;
  local_2b8 = "Render at least this many frames (default: 0) (NYI)";
  local_290 = &local_5cc;
  local_5cc = 0xffffffff;
  local_2b0 = "<frame_count>";
  local_2a8 = "render-max";
  local_2a0 = 0x65;
  local_29c = 0x200000000;
  local_288 = "Render at most this many frames (default: -1)";
  local_280 = "<frame_count>|-1 (unlimited)";
  local_278 = "record-max-start-silence";
  local_260 = &local_668.recordMaxStartSilentFrames;
  local_668.recordMaxStartSilentFrames = 0;
  local_668.recordMaxEndSilentFrames = 0;
  local_668.recordMaxLA32EndSilentFrames = 0;
  local_668.waitForLA32 = 1;
  local_270 = 0;
  local_26c = 0x200000000;
  local_258 = "Record at most this many silent frames at the start of each SMF file (default: 0)";
  local_250 = "<frame_count>|-1 (unlimited)";
  local_248 = "record-max-end-silence";
  local_230 = &local_668.recordMaxEndSilentFrames;
  local_240 = 0;
  local_23c = 0x200000000;
  local_228 = "Record at most this many silent frames at the end of each SMF file (default: 0)";
  local_220 = "<frame_count>|-1 (unlimited)";
  local_218 = "record-max-la32-end-silence";
  local_210 = 0;
  local_20c = 0x200000000;
  local_200 = &local_668.recordMaxLA32EndSilentFrames;
  local_1f8 = 
  "Record at most this many silent frames produced by the emulated LA32 before it becomes inactive (default: 0)"
  ;
  local_1d0 = &local_668.waitForLA32;
  local_1f0 = "<frame_count>|-1 (unlimited)";
  local_1e8 = "no-wait-for-la32";
  local_1e0 = 0x74;
  local_1dc = 4;
  local_1c8 = 
  "Don\'t wait for all partials to become inactive after each SMF file has ended. Implies no-wait-for-reverb."
  ;
  local_1c0 = 0;
  local_1b8 = "no-wait-for-reverb";
  local_1a0 = &local_668.waitForReverb;
  local_668.waitForReverb = 1;
  local_668.sendAllNotesOff = 1;
  local_668.niceAmpRamp = 1;
  local_668.nicePanning = 0;
  local_1b0 = 0;
  local_1ac = 4;
  local_198 = "Don\'t wait for reverb to finish after each SMF file has ended.";
  local_190 = 0;
  local_188 = "no-send-all-notes-off";
  local_170 = &local_668.sendAllNotesOff;
  local_180 = 0;
  local_17c = 4;
  local_168 = 
  "Don\'t release the hold pedal and perform all-notes-off on all parts in the emulator at the end of each SMF file.\n                WARNING: Sound can theoretically continue forever if not limited by other options."
  ;
  local_160 = 0;
  local_158 = "no-nice-amp-ramp";
  local_150 = 0;
  local_14c = 4;
  local_140 = &local_668.niceAmpRamp;
  local_138 = 
  "Emulate amplitude ramp accurately.\n                Quick changes of volume or expression on a MIDI channel may result in amp jumps which are avoided by default."
  ;
  local_130 = 0;
  local_128 = "nice-panning";
  local_110 = &local_668.nicePanning;
  local_120 = 0;
  local_11c = 0;
  local_108 = 
  "Enlarges the pan setting accuracy to 4 bits providing for smoother panning.\n                By default, we accurately emulate the LA32 chip that only supports the pan setting accuracy of 3 bits."
  ;
  local_100 = 0;
  local_f8 = "nice-partial-mixing";
  local_e0 = &local_668.nicePartialMixing;
  local_668.nicePartialMixing = 0;
  local_f0 = 0;
  local_ec = 0;
  local_d8 = 
  "Disables occasional counter-phase mixing of partials that the LA32 chip exhibits.\n                Timbres with closely sounding partials may sound quite differently, or even cancel out if mixed counter-phase.\n                Enabling this option makes the behaviour more predictable."
  ;
  local_d0 = 0;
  local_c8 = "s";
  local_c0 = 0x73;
  local_bc = 0x400000000;
  local_b0 = &local_6a0;
  local_6a0 = (gchar *)0x0;
  local_a8 = 
  "[DEPRECATED] Play this SMF or sysex file before any other. DEPRECATED: Instead just specify the file first in the file list."
  ;
  local_a0 = "<midi_file>";
  local_98 = "";
  local_90 = 0;
  local_8c = 0x600000000;
  local_80 = &local_668;
  local_78 = 0;
  local_70 = "<midi_file> [midi_file...]";
  local_68 = 0;
  local_60 = 0;
  local_5c = 0;
  local_40 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_688 = argv;
  local_5bc = argc;
  uVar12 = g_option_context_new("- record MIDI played through the MT-32 emulator to a file");
  g_option_context_add_main_entries(uVar12,local_578,0);
  local_580 = 0;
  iVar5 = g_option_context_parse(uVar12,&local_5bc,&local_688);
  if (iVar5 == 0) {
    main_cold_1();
  }
  bVar32 = 3 < local_670;
  if (bVar32) {
    main_cold_2();
  }
  bVar33 = 1 < local_674;
  if (bVar33) {
    main_cold_3();
  }
  bVar34 = OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32 < local_67c;
  if (bVar34) {
    main_cold_4();
  }
  bVar35 = 3 < local_678;
  if (bVar35) {
    main_cold_5();
  }
  bVar36 = 3 < local_66c;
  if (bVar36) {
    main_cold_6();
  }
  bVar3 = (int)local_5c4 < 1;
  if (bVar3) {
    main_cold_7();
  }
  else {
    local_668.bufferFrameCount = local_5c4;
  }
  bVar32 = !bVar3 && (!bVar36 && (!bVar35 && (!bVar34 && (!bVar33 && (!bVar32 && iVar5 != 0)))));
  local_668.partialCount = 8;
  if (8 < (int)local_5c0) {
    local_668.partialCount = local_5c0;
  }
  local_668.renderMaxFrames = 0x7fffffff;
  if (local_5cc < 0x7fffffff) {
    local_668.renderMaxFrames = local_5cc;
  }
  local_668.renderMinFrames = 0;
  if (0 < (int)local_5c8) {
    local_668.renderMinFrames = local_5c8;
  }
  if ((int)local_668.renderMaxFrames < (int)local_5c8) {
    local_668.renderMinFrames = local_668.renderMaxFrames;
  }
  if (local_668.recordMaxStartSilentFrames < 0) {
    local_668.recordMaxStartSilentFrames = 0x7fffffff;
  }
  if (local_668.recordMaxEndSilentFrames < 0) {
    local_668.recordMaxEndSilentFrames = 0x7fffffff;
  }
  if (local_668.recordMaxLA32EndSilentFrames < 0) {
    local_668.recordMaxLA32EndSilentFrames = 0x7fffffff;
  }
  if ((local_698 != (long *)0x0) && (iVar5 = g_strv_length(), iVar5 != 0)) {
    pcVar10 = (char *)*local_698;
    plVar30 = local_698;
    while (pcVar10 != (char *)0x0) {
      plVar30 = plVar30 + 1;
      lVar25 = (long)local_668.rawChannelCount;
      if (lVar25 == 8) {
        main_cold_8();
        bVar32 = false;
        break;
      }
      iVar5 = atoi(pcVar10);
      local_668.rawChannelMap[lVar25] = iVar5;
      if (local_668.rawChannelMap[local_668.rawChannelCount] - 6U < 0xfffffff9) {
        bVar32 = false;
        fprintf(_stderr,
                "Invalid option raw-stream option %s - must be a number between -1 and 5 (inclusive)\n"
                ,pcVar10);
        break;
      }
      local_668.rawChannelCount = local_668.rawChannelCount + 1;
      pcVar10 = (char *)*plVar30;
    }
  }
  if (local_6a0 != (gchar *)0x0) {
    if (local_668.inputFilenames == (gchar **)0x0) {
      uVar28 = 0;
    }
    else {
      uVar6 = g_strv_length();
      uVar28 = (ulong)uVar6;
    }
    iVar5 = (int)uVar28;
    ppgVar13 = (gchar **)g_malloc_n(iVar5 + 2);
    *ppgVar13 = local_6a0;
    ppgVar13[iVar5 + 1] = (gchar *)0x0;
    if (iVar5 != 0) {
      uVar22 = 0;
      do {
        ppgVar13[uVar22 + 1] = local_668.inputFilenames[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar28 != uVar22);
    }
    g_free(local_668.inputFilenames);
    local_668.inputFilenames = ppgVar13;
  }
  if ((local_668.inputFilenames == (gchar **)0x0) || (iVar5 = g_strv_length(), iVar5 == 0)) {
    main_cold_9();
    bVar32 = false;
  }
  local_668.rendererType = RENDERER_TYPES[(int)local_674];
  local_668.outputSampleFormat = local_67c;
  local_668.srcQuality = SRC_QUALITIES[(int)local_678];
  local_668.analogOutputMode = SRC_QUALITIES[(int)local_670];
  g_strfreev(local_698);
  if (local_668.rawChannelCount < 1) {
    local_668.dacInputMode = SRC_QUALITIES[(int)local_66c];
  }
  else {
    local_668.dacInputMode = DACInputMode_PURE;
    local_668.analogOutputMode = AnalogOutputMode_DIGITAL_ONLY;
    local_668.sampleRate = 0;
  }
  if (!bVar32) {
    pcVar10 = (char *)g_option_context_get_help(uVar12,1,0);
    fputs(pcVar10,_stderr);
    freeOptions(&local_668);
  }
  g_option_context_free(uVar12);
  ppgVar13 = local_668.inputFilenames;
  iVar5 = -1;
  if (!bVar32) goto LAB_0010aa99;
  local_690 = local_668.outputFilename;
  if (local_668.outputFilename == (char *)0x0) {
    iVar5 = g_strv_length(local_668.inputFilenames);
    pcVar10 = ppgVar13[iVar5 - 1];
    sVar14 = strlen(pcVar10);
    local_690 = (char *)operator_new__(sVar14 + 5);
    pcVar11 = "%s.wav";
    if (0 < local_668.rawChannelCount) {
      pcVar11 = "%s.raw";
    }
    sprintf(local_690,pcVar11,pcVar10);
  }
  if (local_6d0.c != (mt32emu_context)0x0) {
    mt32emu_free_context(local_6d0.c);
    local_6d0.c = (mt32emu_context)0x0;
  }
  local_6d0.c = mt32emu_create_context((mt32emu_report_handler_i)0x0,(void *)0x0);
  pcVar10 = ".";
  if (local_668.romDir != (char *)0x0) {
    pcVar10 = local_668.romDir;
  }
  sVar14 = strlen(pcVar10);
  local_6c8 = (mt32emu_bit8u *)g_filename_from_utf8(pcVar10,sVar14,0,0);
  romDir = (GDir *)g_dir_open(local_6c8,0,0);
  pgVar4 = local_668.machineID;
  if (romDir == (GDir *)0x0) {
    fwrite("Error reading contents of ROM dir.\n",0x23,1,_stderr);
    g_free(local_6c8);
  }
  else {
    if (local_668.machineID == (char *)0x0) {
      bVar32 = true;
    }
    else {
      iVar5 = strcmp(local_668.machineID,"any");
      bVar32 = iVar5 == 0;
    }
    if (((bVar32) || (iVar5 = strcmp(pgVar4,"mt32"), iVar5 == 0)) ||
       (iVar5 = strcmp(pgVar4,"cm32l"), iVar5 == 0)) {
      local_6b0 = mt32emu_get_machine_ids((char **)0x0,0);
      uVar28 = 0xffffffffffffffff;
      if (local_6b0 < 0x2000000000000000) {
        uVar28 = local_6b0 * 8;
      }
      ppcVar16 = (char **)operator_new__(uVar28);
      mt32emu_get_machine_ids(ppcVar16,local_6b0);
      local_6c0 = ppcVar16;
      if (!bVar32) {
        local_6c0 = (char **)operator_new__(uVar28);
        if (local_6b0 == 0) {
          local_6b0 = 0;
          uVar28 = local_6b0;
        }
        else {
          uVar22 = 0;
          uVar24 = 1;
          uVar31 = 0;
          do {
            pcVar10 = ppcVar16[uVar22];
            iVar5 = strncmp(pgVar4,pcVar10,4);
            uVar28 = uVar31;
            if (iVar5 == 0) {
              uVar28 = (ulong)((int)uVar31 + 1);
              local_6c0[uVar31] = pcVar10;
            }
            bVar32 = uVar24 < local_6b0;
            uVar22 = uVar24;
            uVar24 = (ulong)((int)uVar24 + 1);
            uVar31 = uVar28;
          } while (bVar32);
        }
        local_6b0 = uVar28;
        operator_delete__(ppcVar16);
      }
    }
    else {
      local_6b0 = 1;
      local_6c0 = (char **)0x0;
    }
    if (local_6c0 == (char **)0x0) {
      bVar32 = loadMachineROMs(&local_6d0,(char *)local_6c8,romDir,local_668.machineID,true);
      uVar28 = (ulong)bVar32;
    }
    else {
      uVar12 = g_hash_table_new(0);
      lVar25 = g_dir_read_name();
      if (lVar25 != 0) {
        do {
          pcVar10 = (char *)g_build_filename(local_6c8,lVar25,0);
          sVar14 = strlen(pcVar10);
          pcVar11 = (char *)g_filename_to_utf8(pcVar10,sVar14,0,0);
          sVar14 = strlen(pcVar11);
          pcVar15 = (char *)g_locale_from_utf8(pcVar11,sVar14,0,0);
          mVar7 = mt32emu_identify_rom_file((mt32emu_rom_info *)local_578,pcVar15,(char *)0x0);
          if ((char *)local_578._0_8_ != (char *)0x0 && mVar7 == MT32EMU_RC_OK) {
            g_hash_table_add(uVar12);
          }
          g_free(pcVar15);
          g_free(pcVar11);
          g_free(pcVar10);
          lVar25 = g_dir_read_name();
        } while (lVar25 != 0);
      }
      if (local_6b0 == 0) {
        uVar28 = 0;
      }
      else {
        uVar28 = 0;
        do {
          pcVar10 = local_6c0[local_6b0 - 1];
          rom_ids_size = mt32emu_get_rom_ids((char **)0x0,0,pcVar10);
          uVar22 = rom_ids_size * 8;
          if (0x1fffffffffffffff < rom_ids_size) {
            uVar22 = 0xffffffffffffffff;
          }
          ppcVar16 = (char **)operator_new__(uVar22);
          mt32emu_get_rom_ids(ppcVar16,rom_ids_size,pcVar10);
          if (rom_ids_size != 0) {
            uVar22 = 1;
            local_6a8 = uVar28;
            do {
              iVar5 = g_hash_table_contains(uVar12);
              if (iVar5 != 0) {
                g_dir_rewind(romDir);
                bVar32 = loadMachineROMs(&local_6d0,(char *)local_6c8,romDir,pcVar10,false);
                if (bVar32) {
                  uVar28 = CONCAT71((int7)(uVar22 >> 8),1);
                  break;
                }
              }
              bVar32 = uVar22 < rom_ids_size;
              uVar28 = local_6a8;
              uVar22 = (ulong)((int)uVar22 + 1);
            } while (bVar32);
          }
          uVar22 = local_6b0 - 1;
          operator_delete__(ppcVar16);
          local_6b0 = uVar22;
        } while ((uVar22 != 0) && ((uVar28 & 1) == 0));
      }
      g_hash_table_destroy(uVar12);
      if ((uVar28 & 1) == 0) {
        main_cold_10();
      }
      operator_delete__(local_6c0);
    }
    g_dir_close(romDir);
    g_free(local_6c8);
    if ((uVar28 & 1) != 0) {
      mt32emu_set_stereo_output_samplerate(local_6d0.c,(double)local_668.sampleRate);
      mt32emu_set_samplerate_conversion_quality(local_6d0.c,local_668.srcQuality);
      mt32emu_set_partial_count(local_6d0.c,local_668.partialCount);
      mt32emu_set_analog_output_mode(local_6d0.c,local_668.analogOutputMode);
      mt32emu_select_renderer_type(local_6d0.c,local_668.rendererType);
      mVar7 = mt32emu_open_synth(local_6d0.c);
      if (mVar7 == MT32EMU_RC_OK) {
        mt32emu_set_dac_input_mode(local_6d0.c,local_668.dacInputMode);
        if (local_668.niceAmpRamp == 0) {
          mt32emu_set_nice_amp_ramp_enabled(local_6d0.c,MT32EMU_BOOL_FALSE);
        }
        if (local_668.nicePanning != 0) {
          mt32emu_set_nice_panning_enabled(local_6d0.c,MT32EMU_BOOL_TRUE);
        }
        if (local_668.nicePartialMixing != 0) {
          mt32emu_set_nice_partial_mixing_enabled(local_6d0.c,MT32EMU_BOOL_TRUE);
        }
        local_668.sampleRate = mt32emu_get_actual_stereo_output_samplerate(local_6d0.c);
        printf("Using output sample rate %d Hz\n",(ulong)(uint)local_668.sampleRate);
        pcVar10 = local_690;
        sVar14 = strlen(local_690);
        pcVar11 = (char *)g_filename_to_utf8(pcVar10,sVar14,0,0,0);
        sVar14 = strlen(pcVar11);
        pcVar10 = (char *)g_locale_from_utf8(pcVar11,sVar14,0,0,0);
        if ((local_668.force == 0) && (iVar5 = g_file_test(local_690,0x10), iVar5 != 0)) {
          __s = (FILE *)0x0;
          fprintf(_stderr,"Destination file \'%s\' exists.\n",pcVar10);
        }
        else {
          __s = fopen(pcVar10,"wb");
        }
        cVar17 = clock();
        if (__s == (FILE *)0x0) {
          fprintf(_stderr,"Error opening file \'%s\' for writing.\n",pcVar10);
        }
        else {
          if (local_668.rawChannelCount < 1) {
            uVar6 = (uint)(local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) * 0x10
                    + 0x10;
            uVar21 = uVar6 >> 2;
            iVar5 = uVar21 * local_668.sampleRate;
            local_578._16_4_ = 0x10;
            local_578._36_4_ = 0x61746164;
            local_578._40_4_ = 0;
            local_578._0_8_ = (char *)0x46464952;
            local_578._8_4_ = 0x45564157;
            local_578._12_4_ = 0x20746d66;
            local_578._21_3_ = 0x200;
            local_578[0x14] =
                 (local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) * '\x02' +
                 '\x01';
            local_578[0x18] = (undefined1)local_668.sampleRate;
            local_578[0x19] = (undefined1)((uint)local_668.sampleRate >> 8);
            local_578[0x1a] = (undefined1)((uint)local_668.sampleRate >> 0x10);
            local_578[0x1b] = (undefined1)((uint)local_668.sampleRate >> 0x18);
            local_578[0x1c] = (undefined1)iVar5;
            local_578[0x1d] = (undefined1)((uint)iVar5 >> 8);
            local_578[0x1e] = (undefined1)((uint)iVar5 >> 0x10);
            local_578[0x1f] = (undefined1)((uint)iVar5 >> 0x18);
            local_578[0x20] = (undefined1)uVar21;
            local_578[0x21] = 0;
            local_578[0x22] = (undefined1)uVar6;
            local_578[0x23] = 0;
            sVar14 = fwrite(local_578,1,0x2c,__s);
            if (sVar14 == 0x2c) goto LAB_0010a019;
            fprintf(_stderr,"Error writing WAVE header to \'%s\'\n",pcVar10);
          }
          else {
LAB_0010a019:
            local_578[0x20] = 0;
            local_578[0x21] = 0;
            local_578[0x22] = 0;
            local_578[0x23] = 0;
            local_578._36_4_ = 0;
            local_578._40_4_ = 0;
            local_578._44_4_ = 0;
            local_578._16_4_ = 0;
            local_578._20_4_ = 0;
            local_578[0x18] = 0;
            local_578[0x19] = 0;
            local_578[0x1a] = 0;
            local_578[0x1b] = 0;
            local_578[0x1c] = 0;
            local_578[0x1d] = 0;
            local_578[0x1e] = 0;
            local_578[0x1f] = 0;
            local_578._0_8_ = (char *)0x0;
            local_578._8_4_ = 0;
            local_578._12_4_ = 0;
            local_578._48_8_ = (char *)0x0;
            local_578._56_8_ = &local_6d0;
            local_578._64_4_ = SUB84(__s,0);
            local_578._68_4_ = (undefined4)((ulong)__s >> 0x20);
            local_578._72_8_ = local_578._72_8_ & 0xffffffffffff0000;
            local_528 = (char *)0x0;
            uStack_520 = 0;
            local_518 = (char *)0x0;
            local_5a0 = cVar17;
            if (local_668.rawChannelCount < 1) {
              if (local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
                local_578._0_8_ = operator_new__((ulong)(local_668.bufferFrameCount * 2) << 2);
              }
              else {
                local_578._0_8_ = operator_new__((ulong)(local_668.bufferFrameCount * 2) * 2);
              }
            }
            else {
              uVar28 = (ulong)local_668.bufferFrameCount << 2;
              if (local_668.outputSampleFormat != OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
                uVar28 = (ulong)local_668.bufferFrameCount * 2;
              }
              lVar25 = 1;
              do {
                pvVar18 = operator_new__(uVar28);
                *(void **)(local_578 + lVar25 * 8) = pvVar18;
                lVar25 = lVar25 + 1;
              } while (lVar25 != 7);
            }
            local_5b8 = __s;
            local_5b0 = pcVar10;
            local_5a8 = pcVar11;
            for (ppgVar13 = local_668.inputFilenames; cVar17 = local_5a0, pcVar11 = local_5a8,
                pcVar10 = local_5b0, __s = local_5b8, pcVar15 = *ppgVar13, pcVar15 != (char *)0x0;
                ppgVar13 = ppgVar13 + 1) {
              sVar14 = strlen(pcVar15);
              pcVar10 = (char *)g_filename_to_utf8(pcVar15,sVar14,0,0,0);
              sVar14 = strlen(pcVar10);
              local_588 = pcVar10;
              local_6a8 = g_locale_from_utf8(pcVar10,sVar14,0,0);
              local_578[0x48] = ppgVar13[1] == (gchar *)0x0;
              local_698 = (long *)0x0;
              local_6a0 = (gchar *)0x0;
              local_688 = (char **)0x0;
              g_file_get_contents(*ppgVar13,&local_698,&local_6a0);
              uVar12 = local_578._56_8_;
              plVar30 = local_698;
              pgVar4 = local_6a0;
              if (local_688 == (char **)0x0) {
                if ((char)*local_698 == -0x10) {
                  if (local_6a0 != (gchar *)0x0) {
                    pgVar27 = (gchar *)0xffffffffffffffff;
                    pgVar26 = (gchar *)0x0;
                    do {
                      cVar2 = *(char *)((long)plVar30 + (long)pgVar26);
                      if (cVar2 == -9) {
                        if (pgVar27 == (gchar *)0xffffffffffffffff) {
                          pcVar10 = 
                          "Ended a sysex message without a start byte - sysex file \'%s\' may be in an unsupported format.\n"
                          ;
                          pgVar27 = (gchar *)0xffffffffffffffff;
                          goto LAB_0010a2c2;
                        }
                        pmVar1 = (mt32emu_bit8u *)((long)plVar30 + (long)pgVar27);
                        iVar5 = (int)pgVar27;
                        pgVar27 = (gchar *)0xffffffffffffffff;
                        mt32emu_play_sysex_now
                                  (*(mt32emu_context *)uVar12,pmVar1,((int)pgVar26 - iVar5) + 1);
                      }
                      else if ((cVar2 == -0x10) &&
                              (pcVar10 = 
                               "Started a new sysex message before the last finished - sysex file \'%s\' may be in an unsupported format.\n"
                              , bVar32 = pgVar27 != (gchar *)0xffffffffffffffff, pgVar27 = pgVar26,
                              bVar32)) {
LAB_0010a2c2:
                        fprintf(_stderr,pcVar10,local_6a8);
                      }
                      pgVar26 = pgVar26 + 1;
                    } while (pgVar4 != pgVar26);
                  }
                }
                else {
                  smf = smf_load_from_memory(local_698,(int)local_6a0);
                  if (smf == (smf_t *)0x0) {
                    fprintf(_stderr,"Error parsing SMF file \'%s\'.\n",local_6a8);
                  }
                  else {
                    if (local_668.quiet == 0) {
                      pcVar10 = smf_decode(smf);
                      fprintf(_stdout,"%s.\n",pcVar10);
                      free(pcVar10);
                    }
                    if (smf->number_of_tracks < 1) {
                      __assert_fail("smf->number_of_tracks >= 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/src/mt32emu-smf2wav.cpp"
                                    ,0x32e,
                                    "bool playFile(const gchar *, const gchar *, const Options &, State &)"
                                   );
                    }
                    smf_rewind(smf);
                    uVar28 = 0;
                    local_6c8 = (mt32emu_bit8u *)0x0;
                    local_6c0 = (char **)((ulong)local_6c0 & 0xffffffff00000000);
                    local_598 = ppgVar13;
                    do {
                      event = smf_get_next_event(smf);
                      if (event == (smf_event_t *)0x0) {
LAB_0010a3e7:
                        bVar32 = false;
                      }
                      else {
                        if (event->track->track_number < 0) {
                          __assert_fail("event->track->track_number >= 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/src/mt32emu-smf2wav.cpp"
                                        ,0x2a9,"void playSMF(smf_t *, const Options &, State &)");
                        }
                        uVar22 = (ulong)((double)local_668.sampleRate * event->time_seconds);
                        uVar6 = (int)uVar22 - (int)uVar28;
                        if (uVar22 <= uVar28) {
                          uVar6 = 1;
                        }
                        uVar21 = local_668.renderMaxFrames - (int)uStack_520;
                        if (uVar6 + uStack_520 <= (ulong)local_668.renderMaxFrames) {
                          uVar21 = uVar6;
                        }
                        render(uVar21,&local_668,(State *)local_578);
                        uVar28 = uVar28 + uVar21;
                        if (uStack_520 == local_668.renderMaxFrames) goto LAB_0010a3e7;
                        iVar5 = smf_event_is_metadata(event);
                        if (iVar5 == 0) {
                          iVar5 = smf_event_is_sysex(event);
                          if (iVar5 == 0) {
                            iVar5 = smf_event_is_sysex_continuation(event);
                            if (iVar5 == 0) {
                              iVar5 = event->midi_buffer_length;
                              if ((long)iVar5 < 4) {
                                if (iVar5 < 1) {
                                  mVar23 = 0;
                                }
                                else {
                                  pbVar19 = event->midi_buffer;
                                  lVar25 = 0;
                                  mVar23 = 0;
                                  do {
                                    mVar23 = mVar23 | (uint)*pbVar19 << ((byte)lVar25 & 0x1f);
                                    lVar25 = lVar25 + 8;
                                    pbVar19 = pbVar19 + 1;
                                  } while ((long)iVar5 * 8 != lVar25);
                                }
                                bVar32 = true;
                                mt32emu_play_msg(*(mt32emu_context *)local_578._56_8_,mVar23);
                              }
                              else {
                                main_cold_14();
                                bVar32 = true;
                              }
                              goto LAB_0010a3e9;
                            }
                          }
                          iVar5 = smf_event_is_unterminated_sysex(event);
                          local_6b0 = CONCAT44(local_6b0._4_4_,iVar5);
                          bVar32 = iVar5 != 0;
                          iVar5 = smf_event_is_sysex_continuation(event);
                          if (iVar5 == 0) {
                            if (local_6c8 != (mt32emu_bit8u *)0x0) {
                              main_cold_13();
                              local_6c0 = (char **)((ulong)local_6c0 & 0xffffffff00000000);
                            }
                            sysex = event->midi_buffer;
                            mVar23 = event->midi_buffer_length;
                            local_6c8 = (mt32emu_bit8u *)0x0;
                          }
                          else {
                            bVar33 = local_6c8 == (mt32emu_bit8u *)0x0;
                            if (bVar33) {
                              main_cold_12();
                            }
                            bVar32 = !bVar33 || bVar32;
                            sysex = event->midi_buffer + 1;
                            mVar23 = event->midi_buffer_length - 1;
                          }
                          local_6b1 = bVar32;
                          if (bVar32 != false) {
                            mVar29 = (int)local_6c0 + mVar23;
                            mVar8 = 0xffffffff;
                            if (-1 < (int)mVar29) {
                              mVar8 = mVar29;
                            }
                            local_590 = sysex;
                            sysex = (uchar *)operator_new__((long)(int)mVar8);
                            pmVar1 = local_6c8;
                            ppcVar16 = (char **)(long)(int)local_6c0;
                            if (local_6c8 != (mt32emu_bit8u *)0x0) {
                              local_6c0 = ppcVar16;
                              memcpy(sysex,local_6c8,(size_t)ppcVar16);
                              operator_delete__(pmVar1);
                              ppcVar16 = local_6c0;
                            }
                            memcpy(sysex + (long)ppcVar16,local_590,(long)(int)mVar23);
                            local_6c0 = (char **)CONCAT44(local_6c0._4_4_,mVar29);
                            mVar23 = mVar29;
                            local_6c8 = sysex;
                          }
                          bVar32 = true;
                          if ((int)local_6b0 == 0) {
                            mt32emu_play_sysex(((Service *)local_578._56_8_)->c,sysex,mVar23);
                            if (local_6b1 != '\0') {
                              if (local_6c8 != (mt32emu_bit8u *)0x0) {
                                operator_delete__(local_6c8);
                              }
                              local_6c8 = (mt32emu_bit8u *)0x0;
                              local_6c0 = (char **)((ulong)local_6c0 & 0xffffffff00000000);
                            }
                          }
                        }
                        else {
                          pcVar10 = smf_event_decode(event);
                          bVar32 = true;
                          if ((pcVar10 != (char *)0x0) && (local_668.quiet == 0)) {
                            fprintf(_stdout,"Metadata: %s\n",pcVar10);
                          }
                        }
                      }
LAB_0010a3e9:
                    } while (bVar32);
                    flushSilence(MIDI_ENDED,&local_668,(State *)local_578);
                    uVar12 = local_578._56_8_;
                    ppgVar13 = local_598;
                    if (local_668.sendAllNotesOff != 0) {
                      mVar23 = 0x40b0;
                      do {
                        mt32emu_play_msg(*(mt32emu_context *)uVar12,mVar23);
                        mt32emu_play_msg(*(mt32emu_context *)uVar12,mVar23 + 0x3b00);
                        mVar23 = mVar23 + 1;
                      } while (mVar23 != 0x40c0);
                    }
                    pmVar1 = local_6c8;
                    if (((bool)local_578[0x48] == true) && (uStack_520 < local_668.renderMinFrames))
                    {
                      render(local_668.renderMinFrames - (int)uStack_520,&local_668,
                             (State *)local_578);
                    }
                    if (local_668.waitForLA32 != 0) {
                      while (uStack_520 < local_668.renderMaxFrames) {
                        mVar9 = mt32emu_has_active_partials(((Service *)local_578._56_8_)->c);
                        if (mVar9 == MT32EMU_BOOL_FALSE) break;
                        render(1,&local_668,(State *)local_578);
                      }
                      flushSilence(LA32_INACTIVE,&local_668,(State *)local_578);
                      if (local_668.waitForReverb != 0) {
                        uVar6 = local_668.bufferFrameCount;
                        if (0x1fff < local_668.bufferFrameCount) {
                          uVar6 = 0x2000;
                        }
                        if (uStack_520 < local_668.renderMaxFrames) {
                          do {
                            mVar9 = mt32emu_is_active(((Service *)local_578._56_8_)->c);
                            if (mVar9 == MT32EMU_BOOL_FALSE) break;
                            uVar21 = local_668.renderMaxFrames - (int)uStack_520;
                            if (uStack_520 + uVar6 <= (ulong)local_668.renderMaxFrames) {
                              uVar21 = uVar6;
                            }
                            render(uVar21,&local_668,(State *)local_578);
                          } while (uStack_520 < local_668.renderMaxFrames);
                        }
                      }
                    }
                    mVar9 = mt32emu_is_active(((Service *)local_578._56_8_)->c);
                    if (mVar9 == MT32EMU_BOOL_FALSE) {
                      local_528 = (char *)0x0;
                    }
                    if (pmVar1 != (mt32emu_bit8u *)0x0) {
                      operator_delete__(pmVar1);
                    }
                    smf_delete(smf);
                  }
                }
              }
              else {
                fprintf(_stderr,"Error reading file \'%s\': %s\n",local_6a8);
                g_error_free(local_688);
              }
              g_free(local_6a8);
              g_free(local_588);
            }
            if (local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
              if ((char *)local_578._0_8_ != (char *)0x0) {
                operator_delete__((void *)local_578._0_8_);
              }
              lVar25 = 1;
              do {
                if (*(void **)(local_578 + lVar25 * 8) != (void *)0x0) {
                  operator_delete__(*(void **)(local_578 + lVar25 * 8));
                }
                lVar25 = lVar25 + 1;
              } while (lVar25 != 7);
            }
            else {
              if ((char *)local_578._0_8_ != (char *)0x0) {
                operator_delete__((void *)local_578._0_8_);
              }
              lVar25 = 1;
              do {
                if (*(void **)(local_578 + lVar25 * 8) != (void *)0x0) {
                  operator_delete__(*(void **)(local_578 + lVar25 * 8));
                }
                lVar25 = lVar25 + 1;
              } while (lVar25 != 7);
            }
            if (local_668.rawChannelCount == 0) {
              uVar6 = (int)local_518 <<
                      (local_668.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32 | 2U);
              iVar5 = fseek(__s,4,0);
              if (iVar5 == 0) {
                uVar21 = uVar6 + 0x1c;
                iVar5 = fputc(uVar21 & 0xfc,__s);
                if (iVar5 != -1) {
                  iVar5 = fputc(uVar21 >> 8 & 0xff,__s);
                  if (iVar5 != -1) {
                    iVar5 = fputc(uVar21 >> 0x10 & 0xff,__s);
                    if (iVar5 != -1) {
                      iVar5 = fputc(uVar21 >> 0x18,__s);
                      if (iVar5 != -1) {
                        iVar5 = fseek(__s,0x28,0);
                        if (iVar5 == 0) {
                          iVar5 = fputc(uVar6 & 0xfc,__s);
                          if (iVar5 != -1) {
                            iVar5 = fputc(uVar6 >> 8 & 0xff,__s);
                            if (iVar5 != -1) {
                              iVar5 = fputc(uVar6 >> 0x10 & 0xff,__s);
                              if (iVar5 != -1) {
                                iVar5 = fputc(uVar6 >> 0x18,__s);
                                if (iVar5 != -1) goto LAB_0010a9bc;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              main_cold_15();
            }
          }
LAB_0010a9bc:
          fclose(__s);
          cVar20 = clock();
          printf("Elapsed time: %f sec\n",SUB84((double)((float)(cVar20 - cVar17) / 1e+06),0));
        }
        g_free(pcVar10);
        g_free(pcVar11);
      }
      else {
        main_cold_11();
      }
      if (local_6d0.c != (mt32emu_context)0x0) {
        mt32emu_free_context(local_6d0.c);
        local_6d0.c = (mt32emu_context)0x0;
      }
      if (local_668.outputFilename == (char *)0x0) {
        operator_delete__(local_690);
      }
      iVar5 = 0;
      freeOptions(&local_668);
      goto LAB_0010aa99;
    }
  }
  if (local_6d0.c != (mt32emu_context)0x0) {
    mt32emu_free_context(local_6d0.c);
    local_6d0.c = (mt32emu_context)0x0;
  }
  if (local_668.outputFilename == (char *)0x0) {
    operator_delete__(local_690);
  }
  iVar5 = 1;
  freeOptions(&local_668);
LAB_0010aa99:
  if (local_6d0.c != (mt32emu_context)0x0) {
    mt32emu_free_context(local_6d0.c);
  }
  return iVar5;
}

Assistant:

int main(int argc, char *argv[]) {
	Options options;
	MT32Emu::Service service;
	setlocale(LC_ALL, "");
#ifdef BUILD_MT32EMU_VERSION
	const char *mt32emuVersion = BUILD_MT32EMU_VERSION;
#else
	const char *mt32emuVersion = service.getLibraryVersionString();
#endif
	printf("Munt MT32Emu MIDI to Wave Conversion Utility. Version %s\n", MT32EMU_SMF2WAV_VERSION);
	printf("  Copyright (C) 2009, 2011 Jerome Fisher <re_munt@kingguppy.com>\n");
	printf("  Copyright (C) 2012-2022 Jerome Fisher, Sergey V. Mikayev\n");
	printf("Using Munt MT32Emu Library Version %s, libsmf Version %s (with modifications)\n", mt32emuVersion, smf_get_version());
	if (!parseOptions(argc, argv, &options)) {
		return -1;
	}
	gchar *outputFilename;
	if (options.outputFilename != NULL) {
		outputFilename = options.outputFilename;
	} else {
		gchar *lastInputFilename = options.inputFilenames[g_strv_length(options.inputFilenames) - 1];
		size_t allocLen = strlen(lastInputFilename) + 5;
		outputFilename = new gchar[allocLen];
		if(outputFilename == NULL) {
			fprintf(stderr, "Error allocating %lu bytes for destination filename.\n", (unsigned long)allocLen);
			return -1;
		}
		if (options.rawChannelCount > 0) {
			sprintf(outputFilename, "%s.raw", lastInputFilename);
		} else {
			sprintf(outputFilename, "%s.wav", lastInputFilename);
		}
	}

	service.createContext();
	if (!loadROMs(service, options)) {
		service.freeContext();

		if (options.outputFilename == NULL && outputFilename != NULL) {
			delete[] outputFilename;
		}
		freeOptions(&options);
		return 1;
	}
	service.setStereoOutputSampleRate(options.sampleRate);
	service.setSamplerateConversionQuality(options.srcQuality);
	service.setPartialCount(options.partialCount);
	service.setAnalogOutputMode(options.analogOutputMode);
	service.selectRendererType(options.rendererType);
	if (service.openSynth() == MT32EMU_RC_OK) {
		service.setDACInputMode(options.dacInputMode);
		if (!options.niceAmpRamp) {
			service.setNiceAmpRampEnabled(false);
		}
		if (options.nicePanning) {
			service.setNicePanningEnabled(true);
		}
		if (options.nicePartialMixing) {
			service.setNicePartialMixingEnabled(true);
		}
		options.sampleRate = service.getActualStereoOutputSamplerate();
		printf("Using output sample rate %d Hz\n", options.sampleRate);

		char *outputFilenameUtf8 = g_filename_to_utf8(outputFilename, strlen(outputFilename), NULL, NULL, NULL);
		char *outputFilenameLocale = g_locale_from_utf8(outputFilenameUtf8, strlen(outputFilenameUtf8), NULL, NULL, NULL);

		FILE *outputFile;
		bool outputFileExists = false;
		if (!options.force) {
			// FIXME: Lame way of avoiding overwriting an existing file
			// (since it could theoretically be created between us testing and
			// opening for writing)
			if (g_file_test(outputFilename, G_FILE_TEST_EXISTS)) {
				outputFileExists = true;
			}
		}
		if (outputFileExists) {
			fprintf(stderr, "Destination file '%s' exists.\n", outputFilenameLocale);
			outputFile = NULL;
		} else {
#ifdef _MSC_VER
			fopen_s(&outputFile, outputFilenameLocale, "wb");
#else
			outputFile = fopen(outputFilenameLocale, "wb");
#endif
		}

		clock_t startTime = clock();

		if (outputFile != NULL) {
			if (options.rawChannelCount > 0 || writeWAVEHeader(outputFile, options.sampleRate, options.outputSampleFormat)) {
				State state = {NULL, {NULL, NULL, NULL, NULL, NULL, NULL}, service, outputFile, false, false, 0, 0, 0};
				state.outputFile = outputFile;
				if (options.rawChannelCount > 0) {
					for (int i = 0; i < 6; i++) {
						if (options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
							state.rawSampleBuffer[i] = new float[options.bufferFrameCount];
						} else {
							state.rawSampleBuffer[i] = new MT32Emu::Bit16s[options.bufferFrameCount];
						}
					}
				} else {
					if (options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
						state.stereoSampleBuffer = new float[options.bufferFrameCount * 2];
					} else {
						state.stereoSampleBuffer = new MT32Emu::Bit16s[options.bufferFrameCount * 2];
					}
				}
				gchar **inputFilename = options.inputFilenames;
				while (*inputFilename != NULL) {
					char *inputFilenameUtf8 = g_filename_to_utf8(*inputFilename, strlen(*inputFilename), NULL, NULL, NULL);
					char *inputFilenameLocale = g_locale_from_utf8(inputFilenameUtf8, strlen(inputFilenameUtf8), NULL, NULL, NULL);
					state.lastInputFile = *(inputFilename + 1) == NULL; // FIXME: This should actually be true if all subsequent files are sysex
					playFile(*inputFilename, inputFilenameLocale, options, state);
					inputFilename++;
					g_free(inputFilenameLocale);
					g_free(inputFilenameUtf8);
				}
				if (options.outputSampleFormat == OUTPUT_SAMPLE_FORMAT_IEEE_FLOAT32) {
					delete[] static_cast<float *>(state.stereoSampleBuffer);
					for (int i = 0; i < 6; i++) {
						delete[] static_cast<float *>(state.rawSampleBuffer[i]);
					}
				} else {
					delete[] static_cast<MT32Emu::Bit16s *>(state.stereoSampleBuffer);
					for (int i = 0; i < 6; i++) {
						delete[] static_cast<MT32Emu::Bit16s *>(state.rawSampleBuffer[i]);
					}
				}
				if (options.rawChannelCount == 0 && !fillWAVESizes(outputFile, state.writtenFrames, options.outputSampleFormat)) {
					fprintf(stderr, "Error writing final sizes to WAVE header\n");
				}
			} else {
				fprintf(stderr, "Error writing WAVE header to '%s'\n", outputFilenameLocale);
			}
			fclose(outputFile);
			printf("Elapsed time: %f sec\n", float(clock() - startTime) / CLOCKS_PER_SEC);
		} else {
			fprintf(stderr, "Error opening file '%s' for writing.\n", outputFilenameLocale);
		}
		g_free(outputFilenameLocale);
		g_free(outputFilenameUtf8);
	} else {
		fprintf(stderr, "Error opening MT32Emu synthesizer.\n");
	}
	service.freeContext();

	if(options.outputFilename == NULL && outputFilename != NULL) {
		delete[] outputFilename;
	}
	freeOptions(&options);
	return 0;
}